

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O0

void Centaurus::push_arg<int,asmjit::X86Gp>(X86Assembler *as,int arg1,X86Gp *args)

{
  anon_union_16_7_ed616b9d_for_Operand__0 local_98;
  X86Gp *local_88;
  X86Gp *args_local;
  int arg1_local;
  X86Assembler *as_local;
  
  local_98._packed[0].field_10 =
       (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  local_98._mem.field_2 =
       (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2;
  local_88 = args;
  args_local._4_4_ = arg1;
  push_arg<asmjit::X86Gp>(as,(X86Gp *)&local_98._any);
  arg1_local = (int)((ulong)as >> 0x20);
  asmjit::CodeEmitter::emit((CodeEmitter *)args,arg1_local,(int)as);
  return;
}

Assistant:

static void push_arg(asmjit::X86Assembler& as, T1 arg1, Ts... args)
{
	push_arg(as, args...);
	as.push(arg1);
}